

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_inserts.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *pHVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  size_t buffer_size;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char cVar11;
  undefined1 auVar12 [16];
  double dVar13;
  string __str;
  string __str_1;
  HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  buffer;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined4 local_108;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *local_100;
  long *local_f8;
  uint local_f0;
  undefined4 uStack_ec;
  long local_e8 [2];
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *local_d8;
  undefined4 local_d0;
  long local_c8;
  HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  local_c0;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  local_68;
  
  BCL::init((BCL *)0x100,(EVP_PKEY_CTX *)0x0);
  lVar10 = BCL::my_nprocs * 10;
  auVar12._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar12._0_8_ = lVar10;
  auVar12._12_4_ = 0x45300000;
  dVar13 = (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
  dVar13 = dVar13 + dVar13;
  uVar7 = (ulong)dVar13;
  BCL::
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  ::HashMap(&local_68,(long)(dVar13 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = BCL::my_nprocs;
  buffer_size = 1;
  if (BCL::my_nprocs < 0xb) {
    buffer_size = SUB168((ZEXT816(0) << 0x40 | ZEXT816(10)) / auVar1,0);
  }
  BCL::
  HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  ::HashMapBuffer(&local_c0,&local_68,0x14,buffer_size);
  lVar10 = 0;
  do {
    uVar7 = lVar10 + BCL::my_rank * 10;
    cVar11 = '\x01';
    if (9 < uVar7) {
      uVar8 = uVar7;
      cVar4 = '\x04';
      do {
        cVar11 = cVar4;
        if (uVar8 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_00103b4d;
        }
        if (uVar8 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_00103b4d;
        }
        if (uVar8 < 10000) goto LAB_00103b4d;
        bVar5 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar4 = cVar11 + '\x04';
      } while (bVar5);
      cVar11 = cVar11 + '\x01';
    }
LAB_00103b4d:
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar7);
    local_f8 = (long *)CONCAT44(local_f8._4_4_,(int)lVar10);
    bVar5 = BCL::
            HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
            ::insert(&local_c0,&local_128,(int *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      __assert_fail("success",
                    "/workspace/llm4binary/github/license_c_cmakelists/berkeley-container-library[P]bcl/examples/hashmap/buffered_inserts.cpp"
                    ,0x1a,"int main(int, char **)");
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 10) {
      BCL::
      HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
      ::flush(&local_c0);
      if ((BCL::my_rank == 0) && (BCL::my_nprocs != 0)) {
        uVar7 = 0;
        do {
          local_c8 = uVar7 * 10;
          lVar10 = 0;
          do {
            uVar8 = lVar10 + local_c8;
            cVar11 = '\x01';
            if (9 < uVar8) {
              uVar9 = uVar8;
              cVar4 = '\x04';
              do {
                cVar11 = cVar4;
                if (uVar9 < 100) {
                  cVar11 = cVar11 + -2;
                  goto LAB_00103c5c;
                }
                if (uVar9 < 1000) {
                  cVar11 = cVar11 + -1;
                  goto LAB_00103c5c;
                }
                if (uVar9 < 10000) goto LAB_00103c5c;
                bVar5 = 99999 < uVar9;
                uVar9 = uVar9 / 10000;
                cVar4 = cVar11 + '\x04';
              } while (bVar5);
              cVar11 = cVar11 + '\x01';
            }
LAB_00103c5c:
            local_f8 = local_e8;
            std::__cxx11::string::_M_construct((ulong)&local_f8,cVar11);
            std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f8,local_f0,uVar8);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,local_f8,(long)local_f8 + CONCAT44(uStack_ec,local_f0));
            local_108 = 3;
            local_100 = &local_68;
            if (local_f8 != local_e8) {
              operator_delete(local_f8,local_e8[0] + 1);
            }
            pHVar3 = local_100;
            uVar2 = local_108;
            local_f8 = local_e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f8,local_128._M_dataplus._M_p,
                       local_128._M_dataplus._M_p +
                       CONCAT44(local_128._M_string_length._4_4_,(uint)local_128._M_string_length));
            local_d8 = pHVar3;
            local_d0 = uVar2;
            uVar6 = BCL::BlindHashMapReference::operator_cast_to_int
                              ((BlindHashMapReference *)&local_f8);
            if (local_f8 != local_e8) {
              operator_delete(local_f8,local_e8[0] + 1);
            }
            printf("%lu: %d\n",uVar7 + BCL::my_rank * 10,(ulong)uVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 10);
          uVar7 = uVar7 + 1;
        } while (uVar7 < BCL::my_nprocs);
      }
      BCL::finalize();
      std::
      vector<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>,_std::allocator<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>_>_>
      ::~vector(&local_c0.futures);
      std::
      vector<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>,_std::allocator<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>_>
      ::~vector(&local_c0.buffers);
      std::
      vector<BCL::FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>,_std::allocator<BCL::FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>_>_>
      ::~vector(&local_c0.queues);
      BCL::
      HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
      ::~HashMap(&local_68);
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  BCL::init();

  size_t n_to_insert = 10;

  double load_factor = 0.5;
  BCL::HashMap<std::string, int> map(n_to_insert*BCL::nprocs() / load_factor);

  BCL::HashMapBuffer<std::string, int> buffer(map,
                                              n_to_insert*2,
                                              std::max<size_t>(n_to_insert/BCL::nprocs(), 1));

  for (size_t i = 0; i < n_to_insert; i++) {
    bool success = buffer.insert(std::to_string(n_to_insert*BCL::rank() + i), i);
    assert(success);
  }

  buffer.flush();

  if (BCL::rank() == 0) {
    for (size_t i = 0; i < BCL::nprocs(); i++) {

      for (size_t j = 0; j < n_to_insert; j++) {
        auto iter = map.find(std::to_string(n_to_insert*i + j));
        int value = *iter;
        printf("%lu: %d\n", n_to_insert*BCL::rank() + i, value);
      }
    }
  }

  BCL::finalize();
  return 0;
}